

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::DataScriptModule<(wabt::ScriptModuleType)2>::~DataScriptModule
          (DataScriptModule<(wabt::ScriptModuleType)2> *this)

{
  DataScriptModule<(wabt::ScriptModuleType)2> *this_local;
  
  ~DataScriptModule(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

const Location& location() const override { return loc; }